

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O3

void av1_cdef_search(AV1_COMP *cpi)

{
  size_t __n;
  int *__dest;
  undefined4 uVar1;
  undefined4 uVar2;
  uint8_t uVar3;
  CDEF_CONTROL CVar4;
  CDEF_PICK_METHOD pick_method;
  RefCntBuffer *pRVar5;
  YV12_BUFFER_CONFIG *pYVar6;
  SequenceHeader *pSVar7;
  CommonModeInfoParams *pCVar8;
  uint64_t (*pauVar9) [64];
  MB_MODE_INFO *pMVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  CdefSearchCtx *cdef_search_ctx;
  code *pcVar14;
  int *piVar15;
  uint64_t (*pauVar16) [64];
  uint64_t uVar17;
  byte bVar18;
  ushort uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  code *pcVar23;
  uint uVar24;
  size_t size;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  aom_internal_error_info *error_info;
  ulong uVar29;
  long lVar30;
  int iVar31;
  ulong uVar32;
  char *pcVar33;
  ulong uVar34;
  int iVar35;
  int pli;
  ulong uVar36;
  long lVar37;
  bool bVar38;
  uint64_t (*mse [2]) [64];
  int best_lev1 [16];
  int best_lev0 [16];
  uint local_fc;
  ulong local_f8;
  uint64_t (*local_c8) [64];
  uint64_t (*local_c0) [64];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  CVar4 = (cpi->oxcf).tool_cfg.cdef_control;
  if (CVar4 == CDEF_ADAPTIVE) {
    bVar11 = true;
    if ((((cpi->oxcf).mode != '\x02') || (((cpi->oxcf).rc_cfg.mode & ~AOM_CBR) != AOM_CQ)) ||
       (0x20 < (cpi->oxcf).rc_cfg.cq_level)) goto LAB_00208b79;
  }
  else if ((CVar4 != CDEF_REFERENCE) || ((cpi->ppi->rtc_ref).non_reference_frame == 0)) {
    bVar11 = false;
LAB_00208b79:
    if ((cpi->rc).rtc_external_ratectrl == 0) {
      pick_method = (cpi->sf).lpf_sf.cdef_pick_method;
      iVar26 = (cpi->common).quant_params.base_qindex;
      if ((ulong)pick_method != 6) {
        uVar3 = ((cpi->common).seq_params)->monochrome;
        cdef_search_ctx = cpi->cdef_search_ctx;
        if (cdef_search_ctx == (CdefSearchCtx *)0x0) {
          cdef_search_ctx = (CdefSearchCtx *)aom_malloc(0x1f28);
          cpi->cdef_search_ctx = cdef_search_ctx;
          if (cdef_search_ctx == (CdefSearchCtx *)0x0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate cpi->cdef_search_ctx");
            cdef_search_ctx = cpi->cdef_search_ctx;
          }
        }
        pRVar5 = (cpi->common).cur_frame;
        pYVar6 = cpi->source;
        pSVar7 = (cpi->common).seq_params;
        bVar38 = pSVar7->monochrome == '\0';
        uVar24 = bVar38 + 1 + (uint)bVar38;
        cdef_search_ctx->mi_params = &(cpi->common).mi_params;
        cdef_search_ctx->ref = pYVar6;
        uVar1 = (cpi->common).mi_params.mi_rows;
        uVar2 = (cpi->common).mi_params.mi_cols;
        cdef_search_ctx->nvfb = (int)(((uint)(uVar1 + 0xf >> 0x1f) >> 0x1c) + uVar1 + 0xf) >> 4;
        cdef_search_ctx->nhfb = (int)(((uint)(uVar2 + 0xf >> 0x1f) >> 0x1c) + uVar2 + 0xf) >> 4;
        cdef_search_ctx->coeff_shift = pSVar7->bit_depth - AOM_BITS_8;
        cdef_search_ctx->damping = ((cpi->common).quant_params.base_qindex >> 6) + 3;
        iVar25 = nb_cdef_strengths[pick_method];
        cdef_search_ctx->total_strengths = iVar25;
        cdef_search_ctx->num_planes = uVar24;
        cdef_search_ctx->pick_method = pick_method;
        cdef_search_ctx->sb_count = 0;
        cdef_search_ctx->use_highbitdepth = pSVar7->use_highbitdepth != '\0';
        uVar21 = pick_method - CDEF_FAST_SEARCH_LVL1;
        uVar36 = 0;
        av1_setup_dst_planes((cpi->td).mb.e_mbd.plane,pSVar7->sb_size,&pRVar5->buf,0,0,0,uVar24);
        lVar37 = 0x547a;
        do {
          piVar15 = (int *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar37 * 4
                           );
          iVar20 = piVar15[-1];
          cdef_search_ctx->xdec[uVar36] = iVar20;
          iVar35 = *piVar15;
          cdef_search_ctx->ydec[uVar36] = iVar35;
          bVar38 = iVar20 == 0;
          iVar20 = bVar38 + 1 + (uint)bVar38;
          if (iVar35 != 0) {
            iVar20 = (uint)bVar38 * 2;
          }
          cdef_search_ctx->bsize[uVar36] = iVar20;
          cdef_search_ctx->mi_wide_l2[uVar36] = 2 - piVar15[-1];
          cdef_search_ctx->mi_high_l2[uVar36] = 2 - *piVar15;
          memcpy((void *)(lVar37 * 4 + -0x151d8 + (long)cdef_search_ctx),piVar15 + -2,0xa30);
          uVar36 = uVar36 + 1;
          lVar37 = lVar37 + 0x28c;
        } while (uVar24 != uVar36);
        bVar38 = ((cpi->common).seq_params)->use_highbitdepth == '\0';
        pcVar14 = av1_cdef_copy_sb8_16_highbd;
        if (bVar38) {
          pcVar14 = av1_cdef_copy_sb8_16_lowbd;
        }
        pcVar23 = compute_cdef_dist_highbd;
        if (bVar38) {
          pcVar23 = compute_cdef_dist;
        }
        cdef_search_ctx->copy_fn = pcVar14;
        cdef_search_ctx->compute_cdef_dist_fn = pcVar23;
        lVar37 = (long)cdef_search_ctx->nhfb * (long)cdef_search_ctx->nvfb;
        piVar15 = (int *)aom_malloc(lVar37 * 4);
        cdef_search_ctx->sb_index = piVar15;
        if (piVar15 == (int *)0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cdef_search_ctx->sb_index");
        }
        cdef_search_ctx->sb_count = 0;
        size = lVar37 * 0x200;
        pauVar16 = (uint64_t (*) [64])aom_malloc(size);
        cdef_search_ctx->mse[0] = pauVar16;
        if (pauVar16 == (uint64_t (*) [64])0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cdef_search_ctx->mse[0]");
        }
        pauVar16 = (uint64_t (*) [64])aom_malloc(size);
        cdef_search_ctx->mse[1] = pauVar16;
        if (pauVar16 == (uint64_t (*) [64])0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate cdef_search_ctx->mse[1]");
        }
        if ((cpi->mt_info).num_workers < 2) {
          iVar20 = cdef_search_ctx->nvfb;
          if (0 < iVar20) {
            iVar35 = cdef_search_ctx->nhfb;
            iVar13 = 0;
            uVar24 = 0;
            do {
              if (0 < iVar35) {
                lVar37 = 0;
                iVar20 = 0;
                uVar36 = 0;
                do {
                  pCVar8 = cdef_search_ctx->mi_params;
                  iVar27 = pCVar8->mi_rows - (int)((long)(int)uVar24 * 0x10);
                  iVar22 = 0x10;
                  if (iVar27 < 0x10) {
                    iVar22 = iVar27;
                  }
                  if (0 < iVar27) {
                    iVar27 = pCVar8->mi_stride;
                    iVar31 = 1;
                    if (1 < iVar22) {
                      iVar31 = iVar22;
                    }
                    uVar28 = pCVar8->mi_cols + iVar20;
                    if (0xf < (int)uVar28) {
                      uVar28 = 0x10;
                    }
                    pMVar10 = pCVar8->mi_grid_base
                              [uVar36 * 0x10 + (long)iVar27 * (long)(int)uVar24 * 0x10];
                    if ((int)uVar28 < 2) {
                      uVar28 = 1;
                    }
                    pcVar33 = (char *)((long)(iVar13 * iVar27) * 8 + lVar37 +
                                      (long)pCVar8->mi_grid_base);
                    error_info = (aom_internal_error_info *)((long)iVar27 * 8);
                    bVar38 = false;
                    iVar27 = 0;
                    do {
                      if (0 < pCVar8->mi_cols - (int)(uVar36 << 4)) {
                        uVar34 = 0;
                        do {
                          if (*(char *)(*(long *)(pcVar33 + uVar34 * 8) + 0x90) == '\0')
                          goto LAB_00209007;
                          uVar34 = uVar34 + 1;
                        } while (uVar28 != uVar34);
                      }
                      iVar27 = iVar27 + 1;
                      bVar38 = iVar22 <= iVar27;
                      pcVar33 = error_info->detail + (long)(pcVar33 + -8);
                    } while (iVar27 != iVar31);
LAB_00209007:
                    if (((!bVar38) &&
                        (((uVar36 & 1) == 0 || ((pMVar10->bsize & ~BLOCK_4X8) != BLOCK_128X64)))) &&
                       (((uVar24 & 1) == 0 || ((pMVar10->bsize - BLOCK_64X128 & 0xfd) != 0)))) {
                      av1_cdef_mse_calc_block
                                (cdef_search_ctx,error_info,uVar24,(int)uVar36,
                                 cdef_search_ctx->sb_count);
                      cdef_search_ctx->sb_count = cdef_search_ctx->sb_count + 1;
                      iVar35 = cdef_search_ctx->nhfb;
                    }
                  }
                  uVar36 = uVar36 + 1;
                  iVar20 = iVar20 + -0x10;
                  lVar37 = lVar37 + 0x80;
                } while ((long)uVar36 < (long)iVar35);
                iVar20 = cdef_search_ctx->nvfb;
              }
              uVar24 = uVar24 + 1;
              iVar13 = iVar13 + 0x10;
            } while ((int)uVar24 < iVar20);
          }
        }
        else {
          av1_cdef_mse_calc_frame_mt(cpi);
        }
        uVar24 = cdef_search_ctx->sb_count;
        pauVar16 = cdef_search_ctx->mse[0];
        pauVar9 = cdef_search_ctx->mse[1];
        iVar20 = 1;
        if (uVar3 == '\0') {
          iVar20 = iVar25;
        }
        uVar28 = iVar20 * iVar25 - 1;
        uVar12 = 0x1f;
        if (uVar28 != 0) {
          for (; uVar28 >> uVar12 == 0; uVar12 = uVar12 - 1) {
          }
        }
        local_fc = 0;
        uVar28 = (uVar12 ^ 0xffffffe0) + 0x21;
        if (iVar20 * iVar25 == 1) {
          uVar28 = 0;
        }
        iVar25 = (cpi->td).mb.rdmult;
        uVar12 = 3;
        if (uVar28 < 3) {
          uVar12 = uVar28;
        }
        piVar15 = (cpi->common).cdef_info.cdef_strengths;
        __dest = (cpi->common).cdef_info.cdef_uv_strengths;
        local_f8 = 0xffffffffffffffff;
        local_c8 = pauVar16;
        local_c0 = pauVar9;
        uVar28 = 0;
        do {
          bVar18 = (byte)uVar28;
          iVar20 = 1 << (bVar18 & 0x1f);
          local_48 = (undefined1  [16])0x0;
          local_58 = (undefined1  [16])0x0;
          local_68 = (undefined1  [16])0x0;
          local_78 = (undefined1  [16])0x0;
          local_88 = (undefined1  [16])0x0;
          local_98 = (undefined1  [16])0x0;
          local_a8 = (undefined1  [16])0x0;
          local_b8 = (undefined1  [16])0x0;
          if (uVar3 == '\0') {
            iVar35 = 0;
            do {
              search_one_dual((int *)local_78,(int *)local_b8,iVar35,&local_c8,uVar24,pick_method);
              iVar35 = iVar35 + 1;
            } while (iVar20 != iVar35);
            iVar35 = 4 << (bVar18 & 0x1f);
            __n = (ulong)(iVar20 - 1U) * 4;
            do {
              if (uVar28 != 0) {
                memmove(local_78,local_78 + 4,__n);
                memmove(local_b8,local_b8 + 4,__n);
              }
              uVar17 = search_one_dual((int *)local_78,(int *)local_b8,iVar20 - 1U,&local_c8,uVar24,
                                       pick_method);
              iVar35 = iVar35 + -1;
            } while (iVar35 != 0);
            iVar35 = 2;
          }
          else {
            iVar35 = 0;
            do {
              uVar17 = search_one((int *)local_78,iVar35,pauVar16,uVar24,pick_method);
              iVar35 = iVar35 + 1;
            } while (iVar20 != iVar35);
            iVar35 = 1;
            if (4 < uVar21) {
              iVar35 = 4 << (bVar18 & 0x1f);
              do {
                if (uVar28 != 0) {
                  memmove(local_78,local_78 + 4,(ulong)(iVar20 - 1U) * 4);
                }
                uVar17 = search_one((int *)local_78,iVar20 - 1U,pauVar16,uVar24,pick_method);
                iVar35 = iVar35 + -1;
              } while (iVar35 != 0);
              iVar35 = 1;
            }
          }
          uVar36 = uVar17 * 0x800 +
                   ((long)(int)(((6 << (bVar18 & 0x1f)) * iVar35 + uVar28 * uVar24) * 0x200) *
                    (long)iVar25 >> 9);
          if (uVar36 < local_f8) {
            uVar34 = (ulong)(uint)(4 << (bVar18 & 0x1f));
            memcpy(piVar15,local_78,uVar34);
            local_fc = uVar28;
            local_f8 = uVar36;
            if (uVar3 == '\0') {
              memcpy(__dest,local_b8,uVar34);
            }
          }
          bVar38 = uVar28 != uVar12;
          uVar28 = uVar28 + 1;
        } while (bVar38);
        uVar28 = 1 << ((byte)local_fc & 0x1f);
        (cpi->common).cdef_info.cdef_bits = local_fc;
        (cpi->common).cdef_info.nb_cdef_strengths = uVar28;
        if (0 < (int)uVar24) {
          uVar36 = 0;
          while( true ) {
            uVar34 = 0;
            uVar19 = 0;
            if (0 < (int)uVar28) {
              uVar29 = 0xffffffffffffffff;
              uVar32 = 0;
              do {
                uVar17 = pauVar16[uVar36][(cpi->common).cdef_info.cdef_strengths[uVar32]];
                if (uVar3 == '\0') {
                  uVar17 = uVar17 + pauVar9[uVar36][__dest[uVar32]];
                }
                if (uVar17 < uVar29) {
                  uVar34 = uVar32 & 0xffffffff;
                  uVar29 = uVar17;
                }
                uVar32 = uVar32 + 1;
              } while (uVar28 != uVar32);
              uVar19 = (ushort)(((uint)uVar34 & 0xf) << 0xb);
            }
            pMVar10 = (cpi->common).mi_params.mi_grid_base[cdef_search_ctx->sb_index[uVar36]];
            *(ushort *)&pMVar10->field_0xa7 = uVar19 | *(ushort *)&pMVar10->field_0xa7 & 0x87ff;
            uVar36 = uVar36 + 1;
            if (uVar36 == uVar24) break;
            uVar28 = (cpi->common).cdef_info.nb_cdef_strengths;
          }
        }
        if ((uVar21 < 5) && (lVar37 = (long)(cpi->common).cdef_info.nb_cdef_strengths, 0 < lVar37))
        {
          iVar25 = 1;
          if (pick_method != CDEF_FAST_SEARCH_LVL5) {
            iVar25 = (pick_method < CDEF_FAST_SEARCH_LVL3) + 2 +
                     (uint)(pick_method < CDEF_FAST_SEARCH_LVL3);
          }
          lVar30 = 0;
          do {
            iVar20 = (cpi->common).cdef_info.cdef_uv_strengths[lVar30];
            iVar13 = piVar15[lVar30] / iVar25;
            iVar35 = piVar15[lVar30] % iVar25;
            switch(uVar21) {
            case 0:
              piVar15[lVar30] = iVar35 + priconv_lvl1[iVar13] * 4;
              iVar35 = iVar20 + 3;
              if (-1 < iVar20) {
                iVar35 = iVar20;
              }
              iVar20 = iVar20 % 4;
              iVar35 = priconv_lvl1[iVar35 >> 2];
              break;
            case 1:
              piVar15[lVar30] = iVar35 + priconv_lvl2[iVar13] * 4;
              iVar35 = iVar20 + 3;
              if (-1 < iVar20) {
                iVar35 = iVar20;
              }
              iVar20 = iVar20 % 4;
              iVar35 = priconv_lvl2[iVar35 >> 2];
              break;
            case 2:
              piVar15[lVar30] = priconv_lvl2[iVar13] * 4 + secconv_lvl3[iVar35];
              iVar35 = priconv_lvl2[iVar20 / 2];
              goto LAB_002095c1;
            case 3:
              piVar15[lVar30] = priconv_lvl4[iVar13] * 4 + secconv_lvl3[iVar35];
              iVar35 = priconv_lvl4[iVar20 / 2];
LAB_002095c1:
              iVar20 = secconv_lvl3[iVar20 % 2];
              break;
            case 4:
              piVar15[lVar30] = priconv_lvl5[iVar13] << 2;
              iVar35 = priconv_lvl5[iVar20];
              iVar20 = 0;
              break;
            default:
              piVar15[lVar30] = iVar35 + iVar13 * 4;
              iVar35 = iVar20 / iVar25;
              iVar20 = iVar20 % iVar25;
            }
            (cpi->common).cdef_info.cdef_uv_strengths[lVar30] = iVar20 + iVar35 * 4;
            lVar30 = lVar30 + 1;
          } while (lVar37 != lVar30);
        }
        if ((((bVar11) && ((cpi->oxcf).mode == '\x02')) &&
            (((cpi->oxcf).rc_cfg.mode & ~AOM_CBR) == AOM_CQ)) &&
           (((cpi->oxcf).rc_cfg.cq_level < 0xdd &&
            (lVar37 = (long)(cpi->common).cdef_info.nb_cdef_strengths, 0 < lVar37)))) {
          lVar30 = 0;
          do {
            iVar25 = (cpi->common).cdef_info.cdef_strengths[lVar30];
            iVar20 = __dest[lVar30];
            iVar35 = iVar25 + 3;
            if (-1 < iVar25) {
              iVar35 = iVar25;
            }
            iVar13 = iVar20 + 3;
            if (-1 < iVar20) {
              iVar13 = iVar20;
            }
            (cpi->common).cdef_info.cdef_strengths[lVar30] =
                 (iVar25 % 4 >> 1) + (iVar35 >> 2 & 0xfffffffeU) * 2;
            __dest[lVar30] = (iVar20 % 4 >> 1) + (iVar13 >> 2 & 0xfffffffeU) * 2;
            lVar30 = lVar30 + 1;
          } while (lVar37 != lVar30);
        }
        (cpi->common).cdef_info.cdef_damping = (iVar26 >> 6) + 3;
        av1_cdef_dealloc_data(cdef_search_ctx);
        return;
      }
      iVar25 = (cpi->sf).rt_sf.screen_content_cdef_filter_qindex_thresh;
      iVar20 = (cpi->rc).best_quality + 5;
      if (iVar20 < iVar25) {
        iVar20 = iVar25;
      }
      uVar21 = 0;
      if (iVar20 < iVar26) {
        uVar21 = (uint)((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN);
      }
      iVar26 = (cpi->sf).rt_sf.skip_cdef_sb;
    }
    else {
      iVar26 = 0;
      uVar21 = 0;
    }
    av1_pick_cdef_from_qp(&cpi->common,iVar26,uVar21);
    return;
  }
  (cpi->common).cdef_info.nb_cdef_strengths = 1;
  (cpi->common).cdef_info.cdef_strengths[0] = 0;
  (cpi->common).cdef_info.cdef_bits = 0;
  (cpi->common).cdef_info.cdef_uv_strengths[0] = 0;
  return;
}

Assistant:

void av1_cdef_search(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  CDEF_CONTROL cdef_control = cpi->oxcf.tool_cfg.cdef_control;

  assert(cdef_control != CDEF_NONE);
  // For CDEF_ADAPTIVE, turning off CDEF around qindex 32 was best for still
  // pictures
  if ((cdef_control == CDEF_REFERENCE &&
       cpi->ppi->rtc_ref.non_reference_frame) ||
      (cdef_control == CDEF_ADAPTIVE && cpi->oxcf.mode == ALLINTRA &&
       (cpi->oxcf.rc_cfg.mode == AOM_Q || cpi->oxcf.rc_cfg.mode == AOM_CQ) &&
       cpi->oxcf.rc_cfg.cq_level <= 32)) {
    CdefInfo *const cdef_info = &cm->cdef_info;
    cdef_info->nb_cdef_strengths = 1;
    cdef_info->cdef_bits = 0;
    cdef_info->cdef_strengths[0] = 0;
    cdef_info->cdef_uv_strengths[0] = 0;
    return;
  }

  // Indicate if external RC is used for testing
  const int rtc_ext_rc = cpi->rc.rtc_external_ratectrl;
  if (rtc_ext_rc) {
    av1_pick_cdef_from_qp(cm, 0, 0);
    return;
  }
  CDEF_PICK_METHOD pick_method = cpi->sf.lpf_sf.cdef_pick_method;
  if (pick_method == CDEF_PICK_FROM_Q) {
    const int use_screen_content_model =
        cm->quant_params.base_qindex >
            AOMMAX(cpi->sf.rt_sf.screen_content_cdef_filter_qindex_thresh,
                   cpi->rc.best_quality + 5) &&
        cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN;
    av1_pick_cdef_from_qp(cm, cpi->sf.rt_sf.skip_cdef_sb,
                          use_screen_content_model);
    return;
  }
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int damping = 3 + (cm->quant_params.base_qindex >> 6);
  const int fast = (pick_method >= CDEF_FAST_SEARCH_LVL1 &&
                    pick_method <= CDEF_FAST_SEARCH_LVL5);
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *xd = &cpi->td.mb.e_mbd;

  if (!cpi->cdef_search_ctx)
    CHECK_MEM_ERROR(cm, cpi->cdef_search_ctx,
                    aom_malloc(sizeof(*cpi->cdef_search_ctx)));
  CdefSearchCtx *cdef_search_ctx = cpi->cdef_search_ctx;

  // Initialize parameters related to CDEF search context.
  cdef_params_init(&cm->cur_frame->buf, cpi->source, cm, xd, cdef_search_ctx,
                   pick_method);
  // Allocate CDEF search context buffers.
  cdef_alloc_data(cm, cdef_search_ctx);
  // Frame level mse calculation.
  if (cpi->mt_info.num_workers > 1) {
    av1_cdef_mse_calc_frame_mt(cpi);
  } else {
    cdef_mse_calc_frame(cdef_search_ctx, cm->error);
  }

  /* Search for different number of signaling bits. */
  int nb_strength_bits = 0;
  uint64_t best_rd = UINT64_MAX;
  CdefInfo *const cdef_info = &cm->cdef_info;
  int sb_count = cdef_search_ctx->sb_count;
  uint64_t(*mse[2])[TOTAL_STRENGTHS];
  mse[0] = cdef_search_ctx->mse[0];
  mse[1] = cdef_search_ctx->mse[1];
  /* Calculate the maximum number of bits required to signal CDEF strengths at
   * block level */
  const int total_strengths = nb_cdef_strengths[pick_method];
  const int joint_strengths =
      num_planes > 1 ? total_strengths * total_strengths : total_strengths;
  const int max_signaling_bits =
      joint_strengths == 1 ? 0 : get_msb(joint_strengths - 1) + 1;
  int rdmult = cpi->td.mb.rdmult;
  for (int i = 0; i <= 3; i++) {
    if (i > max_signaling_bits) break;
    int best_lev0[CDEF_MAX_STRENGTHS] = { 0 };
    int best_lev1[CDEF_MAX_STRENGTHS] = { 0 };
    const int nb_strengths = 1 << i;
    uint64_t tot_mse;
    if (num_planes > 1) {
      tot_mse = joint_strength_search_dual(best_lev0, best_lev1, nb_strengths,
                                           mse, sb_count, pick_method);
    } else {
      tot_mse = joint_strength_search(best_lev0, nb_strengths, mse[0], sb_count,
                                      pick_method);
    }

    const int total_bits = sb_count * i + nb_strengths * CDEF_STRENGTH_BITS *
                                              (num_planes > 1 ? 2 : 1);
    const int rate_cost = av1_cost_literal(total_bits);
    const uint64_t dist = tot_mse * 16;
    const uint64_t rd = RDCOST(rdmult, rate_cost, dist);
    if (rd < best_rd) {
      best_rd = rd;
      nb_strength_bits = i;
      memcpy(cdef_info->cdef_strengths, best_lev0,
             nb_strengths * sizeof(best_lev0[0]));
      if (num_planes > 1) {
        memcpy(cdef_info->cdef_uv_strengths, best_lev1,
               nb_strengths * sizeof(best_lev1[0]));
      }
    }
  }

  cdef_info->cdef_bits = nb_strength_bits;
  cdef_info->nb_cdef_strengths = 1 << nb_strength_bits;
  for (int i = 0; i < sb_count; i++) {
    uint64_t best_mse = UINT64_MAX;
    int best_gi = 0;
    for (int gi = 0; gi < cdef_info->nb_cdef_strengths; gi++) {
      uint64_t curr = mse[0][i][cdef_info->cdef_strengths[gi]];
      if (num_planes > 1) curr += mse[1][i][cdef_info->cdef_uv_strengths[gi]];
      if (curr < best_mse) {
        best_gi = gi;
        best_mse = curr;
      }
    }
    mi_params->mi_grid_base[cdef_search_ctx->sb_index[i]]->cdef_strength =
        best_gi;
  }
  if (fast) {
    for (int j = 0; j < cdef_info->nb_cdef_strengths; j++) {
      const int luma_strength = cdef_info->cdef_strengths[j];
      const int chroma_strength = cdef_info->cdef_uv_strengths[j];
      int pri_strength, sec_strength;

      STORE_CDEF_FILTER_STRENGTH(cdef_info->cdef_strengths[j], pick_method,
                                 luma_strength);
      STORE_CDEF_FILTER_STRENGTH(cdef_info->cdef_uv_strengths[j], pick_method,
                                 chroma_strength);
    }
  }

  // For CDEF_ADAPTIVE, set primary and secondary CDEF at reduced strength for
  // qindexes 33 through 220.
  // Note 1: for odd strengths, the 0.5 discarded by ">> 1" is a significant
  // part of the strength when the strength is small, and because there are
  // few strength levels, odd strengths are reduced significantly more than a
  // half. This is intended behavior for reduced strength.
  // For example: a pri strength of 3 becomes 1, and a sec strength of 1
  // becomes 0.
  // Note 2: a (signaled) sec strength value of 3 is special as it results in an
  // actual sec strength of 4. We tried adding +1 to the sec strength 3 so it
  // maps to a reduced sec strength of 2. However, on Daala's subset1, the
  // resulting SSIMULACRA 2 scores were either exactly the same (at cpu-used 6),
  // or within noise level (at cpu-used 3). Given that there were no discernible
  // improvements, this special mapping was left out for reduced strength.
  if (cdef_control == CDEF_ADAPTIVE && cpi->oxcf.mode == ALLINTRA &&
      (cpi->oxcf.rc_cfg.mode == AOM_Q || cpi->oxcf.rc_cfg.mode == AOM_CQ) &&
      cpi->oxcf.rc_cfg.cq_level <= 220) {
    for (int j = 0; j < cdef_info->nb_cdef_strengths; j++) {
      const int luma_strength = cdef_info->cdef_strengths[j];
      const int chroma_strength = cdef_info->cdef_uv_strengths[j];

      const int new_pri_luma_strength =
          (luma_strength / CDEF_SEC_STRENGTHS) >> 1;
      const int new_sec_luma_strength =
          (luma_strength % CDEF_SEC_STRENGTHS) >> 1;
      const int new_pri_chroma_strength =
          (chroma_strength / CDEF_SEC_STRENGTHS) >> 1;
      const int new_sec_chroma_strength =
          (chroma_strength % CDEF_SEC_STRENGTHS) >> 1;

      cdef_info->cdef_strengths[j] =
          new_pri_luma_strength * CDEF_SEC_STRENGTHS + new_sec_luma_strength;
      cdef_info->cdef_uv_strengths[j] =
          new_pri_chroma_strength * CDEF_SEC_STRENGTHS +
          new_sec_chroma_strength;
    }
  }

  cdef_info->cdef_damping = damping;
  // Deallocate CDEF search context buffers.
  av1_cdef_dealloc_data(cdef_search_ctx);
}